

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                    (QList<QTableWidgetItem_*> *vector,QTableWidgetItem **u,qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  QTableWidgetItem **ppQVar5;
  long in_RDX;
  long *in_RSI;
  QList<QTableWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  qsizetype in_stack_ffffffffffffff78;
  QList<QTableWidgetItem_*> *in_stack_ffffffffffffff80;
  long local_60;
  qsizetype local_48;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = in_RDX;
  if (in_RDX < 0) {
    qVar2 = QList<QTableWidgetItem_*>::size(in_RDI);
    local_10 = in_RDX + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    local_60 = *plVar3;
  }
  qVar2 = QList<QTableWidgetItem_*>::size(in_RDI);
  if (local_60 < qVar2) {
    local_20.i = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    QList<QTableWidgetItem_*>::begin(in_stack_ffffffffffffff80);
    QList<QTableWidgetItem_*>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_20 = QList<QTableWidgetItem_*>::const_iterator::operator-
                         ((const_iterator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    cVar4 = QList<QTableWidgetItem_*>::end(in_stack_ffffffffffffff80);
    do {
      this = QList<QTableWidgetItem_*>::const_iterator::operator++(&local_20);
      bVar1 = QList<QTableWidgetItem_*>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_008e43d1;
      ppQVar5 = QList<QTableWidgetItem_*>::const_iterator::operator*(&local_20);
    } while (*ppQVar5 != (QTableWidgetItem *)*in_RSI);
    cVar4 = QList<QTableWidgetItem_*>::begin(in_stack_ffffffffffffff80);
    local_48 = QList<QTableWidgetItem_*>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_008e43d1:
    local_48 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}